

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O2

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  undefined1 *puVar1;
  int *piVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  FILE *pFVar9;
  __jmp_buf_tag *__env;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  long lVar14;
  IOException *pIVar15;
  ulong uVar16;
  long lVar17;
  size_t __n;
  long lVar18;
  ulong d;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  size_t __n_00;
  png_structp png;
  allocator local_139;
  png_infop info;
  ulong local_130;
  int local_124;
  valarray<int> vline;
  valarray<int> nline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long local_b0;
  ulong local_a8;
  long local_a0;
  FILE *local_98;
  png_infop end;
  uint local_88;
  int local_84;
  long local_80;
  long local_78;
  char *local_70;
  void *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar19 = 1;
  local_124 = ds;
  local_a0 = y;
  iVar7 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar7 == '\0') {
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_d0,name,(allocator *)&png);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Can only load PNG image (",&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pFVar9 = fopen(name,"rb");
  if (pFVar9 == (FILE *)0x0) {
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_d0,name,(allocator *)&png);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Cannot open file (",&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_read_struct("1.6.37",0,0);
  if (png == (png_structp)0x0) {
    fclose(pFVar9);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&vline,"Cannot allocate handle for reading PNG files",(allocator *)&nline);
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  info = (png_infop)png_create_info_struct(png);
  if (info == (png_infop)0x0) {
    png_destroy_read_struct(&png,0);
    fclose(pFVar9);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&vline,"Cannot allocate PNG info structure",(allocator *)&nline);
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  end = (png_infop)png_create_info_struct(png);
  if (end == (png_infop)0x0) {
    png_destroy_read_struct(&png,&info,0);
    fclose(pFVar9);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&vline,"Cannot allocate PNG info structure",(allocator *)&nline);
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_70 = name;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar7 = _setjmp(__env);
  if (iVar7 != 0) {
    png_destroy_read_struct(&png,&info,&end);
    fclose(pFVar9);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_d0,local_70,&local_139);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Cannot read PNG file (",&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_98 = pFVar9;
  png_init_io(png,pFVar9);
  png_read_info(png,info);
  uVar8 = png_get_image_width(png,info);
  uVar24 = (ulong)uVar8;
  uVar8 = png_get_image_height(png,info);
  bVar5 = png_get_color_type(png,info);
  if ((byte)(bVar5 - 2) < 5) {
    uVar19 = *(uint *)(&DAT_0014a240 + (ulong)(byte)(bVar5 - 2) * 4);
  }
  local_130 = (ulong)uVar8;
  lVar25 = (long)local_124;
  if (w < 0) {
    w = (long)(lVar25 + uVar24 + -1) / lVar25;
  }
  if (h < 0) {
    h = (long)(local_130 + lVar25 + -1) / lVar25;
  }
  d = (ulong)uVar19;
  local_a8 = w;
  local_88 = uVar19;
  local_60 = h;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,w,h,d);
  sVar3 = image->n;
  __n = -sVar3;
  if (0 < (long)sVar3) {
    __n = sVar3;
  }
  memset(image->pixel,0,__n);
  if (bVar5 == 3) {
    png_set_palette_to_rgb(png);
  }
  bVar6 = png_get_bit_depth(png,info);
  if (8 < bVar6) {
    png_destroy_read_struct(&png,&info,&end);
    fclose(local_98);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_d0,local_70,&local_139);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "PNG with <= 8 bits expected (",&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (bVar6 == 8 || bVar5 != 0) {
    if ((bVar5 & 4) != 0) {
      png_set_strip_alpha(png);
    }
  }
  else {
    png_set_expand_gray_1_2_4_to_8(png);
  }
  png_read_update_info(png,info);
  iVar7 = png_get_rowbytes(png,info);
  uVar16 = local_130;
  uVar10 = (long)iVar7 * local_130;
  uVar20 = 0xffffffffffffffff;
  if (-1 < (long)uVar10) {
    uVar20 = uVar10;
  }
  pvVar11 = operator_new__(uVar20);
  pvVar12 = operator_new__(uVar16 * 8);
  pvVar13 = pvVar11;
  for (uVar16 = 0; local_130 != uVar16; uVar16 = uVar16 + 1) {
    *(void **)((long)pvVar12 + uVar16 * 8) = pvVar13;
    pvVar13 = (void *)((long)pvVar13 + (long)iVar7);
  }
  local_68 = pvVar11;
  png_read_image(png,pvVar12);
  if ((((local_124 < 2) && (local_a0 == 0 && x == 0)) && (local_a8 == uVar24)) &&
     (local_60 == local_130)) {
    for (uVar16 = 0; uVar16 != local_130; uVar16 = uVar16 + 1) {
      uVar10 = 0;
      uVar20 = uVar10;
      for (; uVar10 != uVar24; uVar10 = uVar10 + 1) {
        uVar20 = (ulong)(int)uVar20;
        for (lVar25 = 0; d << 3 != lVar25; lVar25 = lVar25 + 8) {
          puVar1 = (undefined1 *)(*(long *)((long)pvVar12 + uVar16 * 8) + uVar20);
          uVar20 = uVar20 + 1;
          *(undefined1 *)(*(long *)(*(long *)((long)image->img + lVar25) + uVar16 * 8) + uVar10) =
               *puVar1;
        }
      }
    }
  }
  else {
    nline._M_size._0_4_ = 0;
    __n_00 = local_a8 * d;
    std::valarray<int>::valarray(&vline,(int *)&nline,__n_00);
    local_d0._M_dataplus._M_p._0_4_ = 0;
    std::valarray<int>::valarray(&nline,(int *)&local_d0,__n_00);
    lVar21 = 0;
    lVar17 = lVar25 * local_a0;
    if (lVar25 * local_a0 < 1) {
      lVar17 = lVar21;
    }
    lVar14 = -local_a0;
    if (-local_a0 == 0 || 0 < local_a0) {
      lVar14 = lVar21;
    }
    local_84 = 0;
    if (0 < x) {
      local_84 = (int)x;
    }
    local_84 = local_84 * local_88 * local_124;
    local_b0 = -x;
    if (-x == 0 || 0 < x) {
      local_b0 = lVar21;
    }
    local_78 = local_b0 * d;
    local_38 = local_78 * 4;
    local_40 = d * 4;
    local_48 = d * 8;
    while ((lVar14 < (long)local_60 &&
           (local_50 = (local_a0 + lVar14) * lVar25, local_50 < (long)local_130))) {
      local_d0._M_dataplus._M_p._0_4_ = 0;
      local_80 = lVar14;
      std::valarray<int>::operator=(&vline,(int *)&local_d0);
      local_d0._M_dataplus._M_p._0_4_ = 0;
      std::valarray<int>::operator=(&nline,(int *)&local_d0);
      lVar17 = (long)(int)lVar17;
      lVar21 = 0;
      while ((lVar22 = lVar21, lVar21 = local_78, lVar14 = local_b0, lVar22 < lVar25 &&
             (lVar18 = local_38, iVar7 = local_84, local_50 + lVar22 < (long)local_130))) {
        for (; (lVar14 < (long)local_a8 && (lVar21 = (lVar14 + x) * lVar25, lVar21 < (long)uVar24));
            lVar14 = lVar14 + 1) {
          for (lVar23 = 0; (lVar23 < lVar25 && (lVar21 + lVar23 < (long)uVar24));
              lVar23 = lVar23 + 1) {
            lVar4 = *(long *)((long)pvVar12 + lVar17 * 8);
            for (uVar16 = 0; d != uVar16; uVar16 = uVar16 + 1) {
              piVar2 = (int *)((long)vline._M_data + uVar16 * 4 + lVar18);
              *piVar2 = *piVar2 + (uint)*(byte *)(iVar7 + lVar4 + uVar16);
              piVar2 = (int *)((long)nline._M_data + uVar16 * 4 + lVar18);
              *piVar2 = *piVar2 + 1;
            }
            iVar7 = iVar7 + (int)uVar16;
          }
          lVar18 = lVar18 + local_40;
        }
        lVar17 = lVar17 + 1;
        local_58 = lVar22;
        lVar21 = lVar22 + 1;
      }
      for (; (lVar14 < (long)local_a8 && ((x + lVar14) * lVar25 < (long)uVar24));
          lVar14 = lVar14 + 1) {
        for (lVar22 = 0; local_48 != lVar22; lVar22 = lVar22 + 8) {
          uVar19 = nline._M_data[lVar21];
          if (0 < (int)uVar19) {
            *(char *)(*(long *)(*(long *)((long)image->img + lVar22) + local_80 * 8) + lVar14) =
                 (char)((int)((uVar19 >> 1) + vline._M_data[lVar21]) / (int)uVar19);
          }
          lVar21 = lVar21 + 1;
        }
      }
      lVar14 = local_80 + 1;
    }
    operator_delete(nline._M_data);
    operator_delete(vline._M_data);
  }
  pvVar13 = local_68;
  pFVar9 = local_98;
  operator_delete__(pvVar12);
  operator_delete__(pvVar13);
  png_destroy_read_struct(&png,&info,&end);
  fclose(pFVar9);
  return;
}

Assistant:

void PNGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("PNG with <= 8 bits expected ("+std::string(name)+")");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  png_read_update_info(png, info);

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[rk][jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}